

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall
cfd::core::SigHashType::SigHashType
          (SigHashType *this,SigHashAlgorithm algorithm,bool is_anyone_can_pay,bool is_fork_id)

{
  bool is_fork_id_local;
  bool is_anyone_can_pay_local;
  SigHashAlgorithm algorithm_local;
  SigHashType *this_local;
  
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = algorithm;
  this->is_anyone_can_pay_ = is_anyone_can_pay;
  this->is_fork_id_ = is_fork_id;
  return;
}

Assistant:

SigHashType::SigHashType(
    SigHashAlgorithm algorithm, bool is_anyone_can_pay, bool is_fork_id)
    : hash_algorithm_(algorithm),
      is_anyone_can_pay_(is_anyone_can_pay),
      is_fork_id_(is_fork_id) {
  // nothing
}